

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON_UUID WcsMappingId(ON_Xform *ocsTransform,bool bBox)

{
  undefined4 current_remainder;
  undefined2 uVar1;
  undefined2 uVar2;
  uchar auVar3 [8];
  ON_UUID OVar4;
  ON__UINT32 OVar5;
  ON_UUID *local_30;
  bool bBox_local;
  ON_Xform *ocsTransform_local;
  ON_UUID uuid;
  
  if (bBox) {
    local_30 = &WcsMappingId::uuidBaseWcsBox;
  }
  else {
    local_30 = &WcsMappingId::uuidBaseWcs;
  }
  current_remainder = local_30->Data1;
  uVar1 = local_30->Data2;
  uVar2 = local_30->Data3;
  OVar4.Data3 = uVar2;
  OVar4.Data2 = uVar1;
  auVar3 = *&local_30->Data4;
  OVar5 = ON_Xform::CRC32(ocsTransform,current_remainder);
  OVar4.Data1 = OVar5;
  OVar4.Data4 = auVar3;
  return OVar4;
}

Assistant:

static ON_UUID WcsMappingId(const ON_Xform& ocsTransform, bool bBox)
{
  // {47D62129-341E-4E3D-BF11-9C051AF4ED98}
  static const ON_UUID uuidBaseWcs =
  { 0x47d62129, 0x341e, 0x4e3d, { 0xbf, 0x11, 0x9c, 0x5, 0x1a, 0xf4, 0xed, 0x98 } };

  // {4DC9AA78-9617-46FB-923F-3E65E14182FC}
  static const ON_UUID uuidBaseWcsBox =
  { 0x4dc9aa78, 0x9617, 0x46fb, { 0x92, 0x3f, 0x3e, 0x65, 0xe1, 0x41, 0x82, 0xfc } };

  ON_UUID uuid = bBox ? uuidBaseWcsBox : uuidBaseWcs;
  uuid.Data1 = ocsTransform.CRC32(uuid.Data1);
  return uuid;
}